

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

bool __thiscall helics::CommsInterface::propertyLock(CommsInterface *this)

{
  bool bVar1;
  bool exp;
  
  exp = false;
  do {
    bVar1 = std::atomic<bool>::compare_exchange_weak(&this->operating,&exp,true,seq_cst);
    if (bVar1) {
      return bVar1;
    }
  } while ((this->txStatus)._M_i == STARTUP);
  return bVar1;
}

Assistant:

bool CommsInterface::propertyLock()
{
    bool exp = false;
    while (!operating.compare_exchange_weak(exp, true)) {
        if (txStatus != ConnectionStatus::STARTUP) {
            return false;
        }
    }
    return true;
}